

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_PeginTx2_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_PeginTx2_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  char **in_stack_00000088;
  uint32_t *in_stack_00000090;
  int64_t *in_stack_00000098;
  double in_stack_000000a0;
  char *in_stack_000000a8;
  void *in_stack_000000b0;
  void *in_stack_000000b8;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  char *str_buffer;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  uint32_t append_count;
  char *output_tx_hex;
  int64_t tx_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *fund_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  string txoutproof;
  string btc_tx;
  char *claim_script;
  undefined1 in_stack_00000965;
  undefined1 in_stack_00000966;
  undefined1 in_stack_00000967;
  char *in_stack_00000968;
  int64_t in_stack_00000970;
  uint32_t in_stack_0000097c;
  char *in_stack_00000980;
  void *in_stack_00000988;
  void *in_stack_00000990;
  char *in_stack_000009b0;
  char *in_stack_000009d0;
  uint32_t in_stack_000009d8;
  uint32_t in_stack_000009e0;
  char *in_stack_000009e8;
  bool *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  void **in_stack_fffffffffffffbd8;
  void **lhs_expression;
  void *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  char *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc84;
  undefined1 bool_value;
  char *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffc94;
  char *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 uVar6;
  char *in_stack_fffffffffffffca8;
  allocator *reserved_address;
  AssertHelper in_stack_fffffffffffffd18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  uint32_t in_stack_fffffffffffffd2c;
  void *in_stack_fffffffffffffd30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd38;
  AssertHelper local_2c0;
  Message local_2b8;
  AssertionResult local_2b0;
  AssertHelper local_2a0;
  Message local_298;
  undefined4 local_28c;
  AssertionResult local_288;
  char *local_278;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined8 local_218;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  undefined4 local_1d4;
  char *local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  undefined8 local_f8;
  string local_f0;
  AssertHelper in_stack_ffffffffffffff30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  void *in_stack_ffffffffffffff48;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_94;
  AssertionResult local_90;
  int local_7c;
  long local_78;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  void **local_10;
  
  bool_value = (undefined1)((uint)in_stack_fffffffffffffc84 >> 0x18);
  local_10 = (void **)0x803784;
  reserved_address = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "020000000123edd3be8309747693f42e5b6a0a0c57899fca7d6fb5a8d9c4f52fbf7398f03d00000000000000008001a85e00000000000017a914fdfbf873904e8276428aa892576acd028775fbda8700000000"
             ,reserved_address);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "0400c0209ac0009d7289eb8e52ef1883501b35ec6ee8a5bfc83a09000000000000000000e157506b8e9b09bed1b9a9d6045fa26735547d696d9ce230c7f2003d09704594f558e160ce981317486c10c46e0600000c7eab9226e14b446023e58c32f677298a3a60448556b3b6dcf189ea680035de47fcd1a47ece1bda2de728f1ea7ca166338ddd0ab1ee2797c7cd2c9c5d5d07b055ed58f3b21f1324c98e1c09a8f4dd3a3f5b3a7ca8efc48fcbcb41cbf5476c40e9e3abc1c5d78e4b59dde0cfabf3c47d68f2f83893b19c0079b6902525c41e146ad09cb3859268063fd6e6b123036e6c65a975698553d701e04f0801752a4c454ff689b184b1c48c3fdfc33a7e25c2d96f8b9dfcbbb6b970f7da7ecbccd6f3d33141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b04b0b4b9206faf789f1c0659f100a69eea88bfdc66a2b2382fe628fb159304ffd3f7ef70acc4e0438b1fb380da205c7ae0746dfbb451bb2110a9a25e224455719c6c22fa85161cb1df6fc4a870b337d2de35c7cc478c6658147ea8e1d64e7152d172e425e8e3ffd1cfae750d09193292f6e170a1fbfd65d8d43ecc3c5e0932fddf4b338fb84ae565a87fb78bc9d4d5d32ab8bf1fba7880c08c3a8a3a7e3aa22803bdd602"
             ,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = 0;
  local_7c = CfdCreateHandle(in_stack_fffffffffffffbd8);
  local_94 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffbd8,
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dc1bb);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7d1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x3dc21e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dc273);
  iVar2 = CONCAT13(local_78 != 0,(int3)in_stack_ffffffffffffff44);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(type *)0x3dc29f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff48);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&stack0xffffffffffffff48,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7d2,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff30,(Message *)&stack0xffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message((Message *)0x3dc39d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dc418);
  local_f8 = 0;
  local_7c = CfdInitializeFundRawTx
                       (in_stack_ffffffffffffff48,iVar2,in_stack_ffffffffffffff40,
                        (char *)in_stack_ffffffffffffff38.ptr_,
                        (void **)in_stack_ffffffffffffff30.data_);
  local_10c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffbd8,
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dc508);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7d7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x3dc56b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dc5c3);
  lhs_expression = local_10;
  if (local_7c == 0) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    in_stack_fffffffffffffbd0 = 1;
    in_stack_fffffffffffffbc8 = 0;
    in_stack_fffffffffffffbc0 = 0;
    local_7c = CfdAddTxInputForFundRawTx
                         (in_stack_00000990,in_stack_00000988,in_stack_00000980,in_stack_0000097c,
                          in_stack_00000970,in_stack_00000968,in_stack_000009b0,
                          (bool)in_stack_00000967,(bool)in_stack_00000966,(bool)in_stack_00000965,
                          in_stack_000009d0,in_stack_000009d8,in_stack_000009e0,in_stack_000009e8);
    local_134 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)lhs_expression,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    in_stack_fffffffffffffbd8 = lhs_expression;
    if (!bVar1) {
      testing::Message::Message(&local_140);
      in_stack_fffffffffffffca8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3dc760);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7e3,in_stack_fffffffffffffca8);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x3dc7c3);
      in_stack_fffffffffffffbd8 = lhs_expression;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dc81b);
    iVar2 = CfdAddTargetAmountForFundRawTx
                      (in_stack_fffffffffffffd38.ptr_,in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd2c,(int64_t)in_stack_fffffffffffffd20.ptr_,
                       (char *)in_stack_fffffffffffffd18.data_,(char *)reserved_address);
    local_15c = 0;
    local_7c = iVar2;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffbd8,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffca0);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      in_stack_fffffffffffffc98 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3dc903);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7e7,in_stack_fffffffffffffc98);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x3dc966);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dc9be);
    iVar3 = CfdSetOptionFundRawTx
                      (in_stack_fffffffffffffca8,(void *)CONCAT44(iVar2,uVar6),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (double)in_stack_fffffffffffffc88,(bool)bool_value);
    local_184 = 0;
    local_7c = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffbd8,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc90);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      in_stack_fffffffffffffc88 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3dca9f);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7eb,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x3dcb02);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dcb5a);
    local_7c = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffffca8,(void *)CONCAT44(iVar2,uVar6),
                          (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),CONCAT44(iVar3,uVar5),
                          (double)in_stack_fffffffffffffc88,(bool)bool_value);
    local_1ac = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffbd8,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dcc3b);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7ee,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x3dcc9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dccf6);
    local_1d0 = (char *)0x0;
    local_1d4 = 0;
    local_7c = CfdFinalizeFundRawTx
                         (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                          in_stack_00000098,in_stack_00000090,in_stack_00000088);
    local_1ec = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffbd8,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dce07);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7f6,pcVar4);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x3dce6a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dcebf);
    if (local_7c == 0) {
      local_218 = 0x24;
      testing::internal::EqHelper<false>::Compare<long,long>
                ((char *)in_stack_fffffffffffffbd8,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (long *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (long *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        in_stack_fffffffffffffc58 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3dcf75);
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7f8,in_stack_fffffffffffffc58);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        testing::Message::~Message((Message *)0x3dcfd8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd02d);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_238,"kExpTxData","output_tx_hex",
                 "02000000000141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff02016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000000240000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000005e84001600149aa483fc0fd0b1806f25e57903e4cbefb19c20a100000000"
                 ,local_1d0);
      in_stack_fffffffffffffc57 = testing::AssertionResult::operator_cast_to_bool(&local_238);
      if (!(bool)in_stack_fffffffffffffc57) {
        testing::Message::Message(&local_240);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dd0c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7f9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_248,&local_240);
        testing::internal::AssertHelper::~AssertHelper(&local_248);
        testing::Message::~Message((Message *)0x3dd12b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd180);
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    local_7c = CfdFreeFundRawTxHandle(in_stack_fffffffffffffc98,(void *)CONCAT44(iVar3,uVar5));
    local_25c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffbd8,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dd264);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7fe,pcVar4);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x3dd2c7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd31c);
  }
  local_7c = CfdGetLastErrorCode(in_stack_fffffffffffffbf8);
  if (local_7c != 0) {
    local_278 = (char *)0x0;
    local_7c = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffc58,
                          (char **)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    local_28c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffbd8,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar1) {
      testing::Message::Message(&local_298);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dd41d);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x805,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      testing::Message::~Message((Message *)0x3dd47a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd4cf);
    testing::internal::CmpHelperSTREQ((internal *)&local_2b0,"\"\"","str_buffer","",local_278);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dd564);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x806,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      testing::Message::~Message((Message *)0x3dd5c1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd616);
    CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_278 = (char *)0x0;
  }
  local_7c = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffbd8,
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd30);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffd20);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dd6f2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x80c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffd18,(Message *)&stack0xfffffffffffffd20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd18);
    testing::Message::~Message((Message *)0x3dd74f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd7a4);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_PeginTx2) {
  // signed pegin tx
  const char* claim_script = "0014aab2ed7ac90f976a17ddb850c4a0c4e62db49b07";
  std::string btc_tx = "020000000123edd3be8309747693f42e5b6a0a0c57899fca7d6fb5a8d9c4f52fbf7398f03d00000000000000008001a85e00000000000017a914fdfbf873904e8276428aa892576acd028775fbda8700000000";
  std::string txoutproof = "0400c0209ac0009d7289eb8e52ef1883501b35ec6ee8a5bfc83a09000000000000000000e157506b8e9b09bed1b9a9d6045fa26735547d696d9ce230c7f2003d09704594f558e160ce981317486c10c46e0600000c7eab9226e14b446023e58c32f677298a3a60448556b3b6dcf189ea680035de47fcd1a47ece1bda2de728f1ea7ca166338ddd0ab1ee2797c7cd2c9c5d5d07b055ed58f3b21f1324c98e1c09a8f4dd3a3f5b3a7ca8efc48fcbcb41cbf5476c40e9e3abc1c5d78e4b59dde0cfabf3c47d68f2f83893b19c0079b6902525c41e146ad09cb3859268063fd6e6b123036e6c65a975698553d701e04f0801752a4c454ff689b184b1c48c3fdfc33a7e25c2d96f8b9dfcbbb6b970f7da7ecbccd6f3d33141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b04b0b4b9206faf789f1c0659f100a69eea88bfdc66a2b2382fe628fb159304ffd3f7ef70acc4e0438b1fb380da205c7ae0746dfbb451bb2110a9a25e224455719c6c22fa85161cb1df6fc4a870b337d2de35c7cc478c6658147ea8e1d64e7152d172e425e8e3ffd1cfae750d09193292f6e170a1fbfd65d8d43ecc3c5e0932fddf4b338fb84ae565a87fb78bc9d4d5d32ab8bf1fba7880c08c3a8a3a7e3aa22803bdd602";

  // 1 output data
  static const char* const kTxData = "02000000000141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff0000000000";
  static const char* const kExpTxData = "02000000000141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff02016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000000240000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000005e84001600149aa483fc0fd0b1806f25e57903e4cbefb19c20a100000000";
  static const char* const kFeeAsset = "6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fund_handle = nullptr;
  ret = CfdInitializeFundRawTx(
    handle, kCfdNetworkLiquidv1, 1, kFeeAsset, &fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    ret = CfdAddTxInputForFundRawTx(
        handle, fund_handle,
        "3b34ca92580075265d9548332041796ee7f55f63801835d3a4177f88601bfb41", 0,
        24232,
        "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)",
        kFeeAsset,
        false, false, true, claim_script,
        btc_tx.length() / 2,
        txoutproof.length() / 2, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0,
        1, kFeeAsset, "ex1qn2jg8lq06zccqme9u4us8exta7cecg9p4madau");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxKnapsackMinChange, 0, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee;
    char* output_tx_hex = nullptr;
    uint32_t append_count = 0;
    ret = CfdFinalizeFundRawTx(
        handle, fund_handle, kTxData, 0.1, &tx_fee, &append_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(static_cast<int64_t>(36), tx_fee);
      EXPECT_STREQ(kExpTxData, output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);
    }

    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}